

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceputils.c
# Opt level: O2

char * key_fingerprint(X509_REQ *req)

{
  char *pcVar1;
  BIO_METHOD *type;
  BIO *bp;
  EVP_PKEY *pkey;
  long lVar2;
  EVP_MD_CTX *ctx;
  EVP_MD *type_00;
  byte *md_00;
  uchar *data;
  uchar md [16];
  
  pcVar1 = (char *)malloc(0x21);
  type = BIO_s_mem();
  bp = BIO_new(type);
  pkey = X509_REQ_get_pubkey((X509_REQ *)req);
  i2d_PUBKEY_bio(bp,pkey);
  lVar2 = BIO_ctrl(bp,3,0,&data);
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  type_00 = EVP_md5();
  EVP_DigestInit_ex(ctx,type_00,(ENGINE *)0x0);
  EVP_DigestUpdate(ctx,data,(long)(int)lVar2);
  md_00 = md;
  EVP_DigestFinal_ex(ctx,md_00,(uint *)0x0);
  EVP_MD_CTX_free(ctx);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 2) {
    sprintf(pcVar1 + lVar2,"%02X",(ulong)*md_00);
    md_00 = md_00 + 1;
  }
  pcVar1[0x20] = '\0';
  return pcVar1;
}

Assistant:

char *
key_fingerprint(X509_REQ *req) {
	char		*ret, *str;
	unsigned char	*data, md[MD5_DIGEST_LENGTH];
	int		c, len;
	BIO		*bio;
	EVP_MD_CTX	*mdctx;
	
	/* Assign space for ASCII presentation of the digest */
	str = (char *)malloc(2 * MD5_DIGEST_LENGTH + 1);
	ret = str;

	/* Create new memory bio for reading the public key */
	bio = BIO_new(BIO_s_mem());
	i2d_PUBKEY_bio(bio, X509_REQ_get_pubkey(req));
	len = BIO_get_mem_data(bio, &data);

	/* Calculate MD5 hash: */
	mdctx = EVP_MD_CTX_new();
	EVP_DigestInit_ex(mdctx, EVP_md5(), NULL);
	EVP_DigestUpdate(mdctx, data, len);
	EVP_DigestFinal_ex(mdctx, md, NULL);
	EVP_MD_CTX_free(mdctx);

	/* Copy as ASCII string and return: */
	for (c = 0; c < MD5_DIGEST_LENGTH; c++, str += 2) {
		sprintf((char *)str, "%02X", md[c]);

	}
	*(str) = '\0';
	return(ret);
}